

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void player_resting_complete_special(player *p)

{
  wchar_t wVar1;
  int16_t *piVar2;
  _Bool _Var3;
  
  wVar1 = p->upkeep->resting;
  if ((ushort)wVar1 < 0xfffd) {
    return;
  }
  if (wVar1 == L'\xfffffffd') {
    if (p->chp == p->mhp) goto LAB_001ac83b;
  }
  else {
    if (wVar1 == L'\xfffffffe') {
      if (p->chp != p->mhp) {
        return;
      }
      if ((p->csp != p->msp) &&
         (_Var3 = flag_has_dbg((p->state).pflags,3,0x11,"p->state.pflags","(PF_COMBAT_REGEN)"),
         !_Var3)) {
        return;
      }
      piVar2 = p->timed;
      if (piVar2[2] != 0) {
        return;
      }
      if (piVar2[4] != 0) {
        return;
      }
      if (piVar2[7] != 0) {
        return;
      }
      if (piVar2[5] != 0) {
        return;
      }
      if (piVar2[0x1c] != 0) {
        return;
      }
      if (piVar2[9] != 0) {
        return;
      }
      if (piVar2[8] != 0) {
        return;
      }
      if (piVar2[1] != 0) {
        return;
      }
      if (piVar2[3] != 0) {
        return;
      }
      if (piVar2[6] != 0) {
        return;
      }
      if (p->word_recall != 0) {
        return;
      }
      if (p->deep_descent != 0) {
        return;
      }
      goto LAB_001ac83b;
    }
    if (wVar1 != L'\xffffffff') {
      return;
    }
    if (p->chp != p->mhp) {
      return;
    }
  }
  if (p->csp != p->msp) {
    return;
  }
LAB_001ac83b:
  disturb(p);
  return;
}

Assistant:

void player_resting_complete_special(struct player *p)
{
	/* Complete resting */
	if (!player_resting_is_special(p->upkeep->resting)) return;

	if (p->upkeep->resting == REST_ALL_POINTS) {
		if ((p->chp == p->mhp) && (p->csp == p->msp))
			/* Stop resting */
			disturb(p);
	} else if (p->upkeep->resting == REST_COMPLETE) {
		if ((p->chp == p->mhp) &&
			(p->csp == p->msp || player_has(p, PF_COMBAT_REGEN)) &&
			!p->timed[TMD_BLIND] && !p->timed[TMD_CONFUSED] &&
			!p->timed[TMD_POISONED] && !p->timed[TMD_AFRAID] &&
			!p->timed[TMD_TERROR] && !p->timed[TMD_STUN] &&
			!p->timed[TMD_CUT] && !p->timed[TMD_SLOW] &&
			!p->timed[TMD_PARALYZED] && !p->timed[TMD_IMAGE] &&
			!p->word_recall && !p->deep_descent)
			/* Stop resting */
			disturb(p);
	} else if (p->upkeep->resting == REST_SOME_POINTS) {
		if ((p->chp == p->mhp) || (p->csp == p->msp))
			/* Stop resting */
			disturb(p);
	}
}